

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O1

bool one_object_selected_proc(Am_Object *self)

{
  unsigned_short uVar1;
  Am_Value *pAVar2;
  Am_Object sel_widget;
  Am_Object search_widget;
  Am_Value_List selection;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Value_List local_18;
  
  Am_Object::Get_Object((Am_Object *)&local_18,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_18,10);
  Am_Object::~Am_Object((Am_Object *)&local_18);
  pAVar2 = Am_Object::Get(&local_20,0x197,0);
  Am_Object::Am_Object(&AStack_28,pAVar2);
  pAVar2 = Am_Object::Get(&AStack_28,0x169,0);
  Am_Value_List::Am_Value_List(&local_18,pAVar2);
  uVar1 = Am_Value_List::Length(&local_18);
  Am_Value_List::~Am_Value_List(&local_18);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_20);
  return uVar1 == 1;
}

Assistant:

Am_Define_Formula(bool, one_object_selected)
{
  Am_Object search_widget = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List selection = sel_widget.Get(Am_VALUE);
  return (selection.Length() == 1);
}